

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FACT.c
# Opt level: O0

uint32_t FACTAudioEngine_SetVolume(FACTAudioEngine *pEngine,uint16_t nCategory,float volume)

{
  ushort in_SI;
  long in_RDI;
  float in_XMM0_Da;
  uint16_t i;
  float in_stack_ffffffffffffffe8;
  ushort nCategory_00;
  undefined2 in_stack_fffffffffffffff4;
  
  FAudio_PlatformLockMutex((FAudioMutex)0x113818);
  *(float *)(*(long *)(in_RDI + 0x50) + (ulong)in_SI * 0x18 + 0x14) =
       *(float *)(*(long *)(in_RDI + 0x50) + (ulong)in_SI * 0x18 + 0xc) * in_XMM0_Da;
  for (nCategory_00 = 0; nCategory_00 < *(ushort *)(in_RDI + 0x20); nCategory_00 = nCategory_00 + 1)
  {
    if ((int)*(short *)(*(long *)(in_RDI + 0x50) + (ulong)nCategory_00 * 0x18 + 8) == (uint)in_SI) {
      FACTAudioEngine_SetVolume
                ((FACTAudioEngine *)CONCAT26(in_SI,CONCAT24(in_stack_fffffffffffffff4,in_XMM0_Da)),
                 nCategory_00,in_stack_ffffffffffffffe8);
    }
  }
  FAudio_PlatformUnlockMutex((FAudioMutex)0x1138db);
  return 0;
}

Assistant:

uint32_t FACTAudioEngine_SetVolume(
	FACTAudioEngine *pEngine,
	uint16_t nCategory,
	float volume
) {
	uint16_t i;
	FAudio_PlatformLockMutex(pEngine->apiLock);
	pEngine->categories[nCategory].currentVolume = (
		pEngine->categories[nCategory].volume *
		volume
	);
	for (i = 0; i < pEngine->categoryCount; i += 1)
	{
		if (pEngine->categories[i].parentCategory == nCategory)
		{
			FACTAudioEngine_SetVolume(
				pEngine,
				i,
				pEngine->categories[i].currentVolume
			);
		}
	}
	FAudio_PlatformUnlockMutex(pEngine->apiLock);
	return 0;
}